

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

bool __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::checkNearest
          (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,uchar expectedValue,
          uchar expectedBorderColor,GLint layer)

{
  ostringstream *poVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  borderPoints;
  void *local_1f8;
  long lStack_1f0;
  long local_1e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  uint local_1c8;
  uint local_1c4;
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar6 = (this->m_test_configuration).m_width;
  uVar7 = (this->m_test_configuration).m_height;
  uVar2 = (this->m_test_configuration).m_n_in_components;
  local_1c8 = (this->m_test_configuration).m_n_out_components;
  local_1d8 = (ulong)(uVar6 >> 1);
  local_1d0 = (ulong)(uVar7 >> 1);
  if (local_1c8 < uVar2) {
    uVar2 = local_1c8;
  }
  local_1e0 = buffer;
  if (uVar2 != 0) {
    uVar8 = 0;
    do {
      uVar5 = (uVar6 * (uVar7 >> 1) + (uVar6 >> 1)) * local_1c8 + (int)uVar8;
      if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5] != expectedValue) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Wrong value for layer (",0x17);
        std::ostream::operator<<(poVar1,layer);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,") at point (x,y)  = (",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") , component (",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Expected value [",0x10);
        std::ostream::operator<<(poVar1,(uint)expectedValue);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Result   value [",0x10);
        std::ostream::operator<<
                  (poVar1,(uint)(local_1e0->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  local_1f8 = (void *)0x0;
  lStack_1f0 = 0;
  local_1e8 = 0;
  local_1b8 = (ulong)uVar7;
  local_1b0._4_4_ = uVar7 / 6;
  local_1b0._0_4_ = uVar6 / 6;
  local_1c4 = uVar6;
  local_1c0 = this;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = (uint)local_1d8;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar5 = (uint)(long)(((double)uVar6 / 6.0) * 5.0);
  local_1b0._4_4_ = uVar7 / 6;
  local_1b0._0_4_ = uVar5;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar7 = (uint)local_1d0;
  local_1b0._4_4_ = uVar7;
  local_1b0._0_4_ = uVar6 / 6;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar5;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar7 = (uint)(long)(((double)(long)local_1b8 / 6.0) * 5.0);
  local_1b0._4_4_ = uVar7;
  local_1b0._0_4_ = uVar6 / 6;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = (uint)local_1d8;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar5;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_1f8,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  bVar3 = true;
  if (lStack_1f0 - (long)local_1f8 != 0) {
    uVar8 = 0;
    do {
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          uVar6 = (*(int *)((long)local_1f8 + uVar8 * 8 + 4) * local_1c4 +
                  *(int *)((long)local_1f8 + uVar8 * 8)) * local_1c8 + (int)uVar4;
          if ((local_1e0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
              .super__Vector_impl_data._M_start[uVar6] != expectedBorderColor) {
            local_1b0._0_8_ =
                 ((local_1c0->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Wrong value for layer (",0x17);
            std::ostream::operator<<(poVar1,layer);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") at point (x,y)  = (",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") , component (",0xf);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Expected value [",0x10);
            std::ostream::operator<<(poVar1,(uint)expectedBorderColor);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Result   value [",0x10);
            std::ostream::operator<<
                      (poVar1,(uint)(local_1e0->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar6]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar3 = false;
            goto LAB_00cd04d5;
          }
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < (ulong)(lStack_1f0 - (long)local_1f8 >> 3));
    bVar3 = true;
  }
LAB_00cd04d5:
  if (local_1f8 != (void *)0x0) {
    operator_delete(local_1f8,local_1e8 - (long)local_1f8);
  }
  return bVar3;
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkNearest(std::vector<OutputType>& buffer,
																			OutputType expectedValue,
																			OutputType expectedBorderColor,
																			glw::GLint layer)
{
	glw::GLuint width		   = m_test_configuration.get_width();
	glw::GLuint height		   = m_test_configuration.get_height();
	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;
	glw::GLuint index		   = 0;

	/* Check if center point is equal to expectedValue */
	std::pair<glw::GLuint, glw::GLuint> centerPoint(width / 2, height / 2);

	for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
	{
		index = centerPoint.second * outRowWidth + centerPoint.first * out_components + i;
		if (buffer[index] != expectedValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer << ") at point (x,y)  = ("
							   << centerPoint.first << "," << centerPoint.second << ") , component (" << i << ")\n"
							   << "Expected value [" << (glw::GLint)expectedValue << "]\n"
							   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
							   << tcu::TestLog::EndMessage;
			return false;
		}
	}

	/* Check if following points (marked as BC) contain values equal border color
	 *
	 *                 (-1, -1)    (0, -1)  (1,  -1)     (2, -1)
	 *                         *-------+-------+-------*
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 0) +-------+-------+-------+ (2, 0)
	 *                         |       |       |       |
	 *                         |  BC   |   0   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 1) +-------+-------+-------+ (2, 1)
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                         *-------+-------+-------*
	 *                 (-1, 2)      (0, 2)  (1, 2)       (2, 2)
	 */

	std::vector<std::pair<glw::GLuint, glw::GLuint> > borderPoints;

	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(
		std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), (glw::GLuint)(height / 6.0 * 5)));

	for (glw::GLuint j = 0; j < borderPoints.size(); ++j)
	{
		for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
		{
			index = borderPoints[j].second * outRowWidth + borderPoints[j].first * out_components + i;
			if (buffer[index] != expectedBorderColor)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer
								   << ") at point (x,y)  = (" << borderPoints[j].first << "," << borderPoints[j].second
								   << ") , component (" << i << ")\n"
								   << "Expected value [" << (glw::GLint)expectedBorderColor << "]\n"
								   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}